

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRBitMatrixParser.cpp
# Opt level: O1

ByteArray *
ZXing::QRCode::ReadCodewords
          (ByteArray *__return_storage_ptr__,BitMatrix *bitMatrix,Version *version,
          FormatInformation *formatInfo)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  BitMatrix *pBVar5;
  BitMatrix *pBVar6;
  invalid_argument *piVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int y;
  uint uVar11;
  byte *pbVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int x;
  byte bVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  uint8_t currentByte;
  BitMatrix functionPattern;
  byte local_f1;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  FormatInformation *local_e0;
  pointer local_d8;
  pointer puStack_d0;
  pointer local_c8;
  ulong local_b8;
  BitMatrix *local_b0;
  BitMatrix local_a8;
  ulong local_80;
  ulong local_78;
  BitMatrix *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  Version *local_50;
  uint local_44;
  uint local_40;
  int local_3c;
  ulong local_38;
  
  local_e0 = formatInfo;
  local_b0 = bitMatrix;
  local_70 = (BitMatrix *)__return_storage_ptr__;
  local_50 = version;
  switch(version->_type) {
  case Model1:
    local_a8._0_8_ = (byte *)0x0;
    local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (byte *)0x0;
    local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
               (long)version->_totalCodewords);
    uVar3 = local_b0->_height;
    local_60 = (ulong)uVar3;
    local_e4 = uVar3 + 3;
    uVar13 = uVar3;
    if ((int)uVar3 < 0) {
      uVar13 = local_e4;
    }
    if (-0xc < (int)uVar3) {
      local_44 = ((int)uVar13 >> 2) + 3;
      uVar11 = (int)uVar3 / 2;
      local_80 = (ulong)uVar11;
      local_38 = (ulong)(((int)uVar13 >> 2) - 2);
      iVar15 = uVar3 - 0xd;
      if (-1 < (int)(uVar3 - 0x10)) {
        iVar15 = uVar3 - 0x10;
      }
      local_f0 = uVar11 - 4;
      iVar15 = iVar15 >> 2;
      iVar17 = uVar3 - 5;
      if (-1 < (int)(uVar3 - 8)) {
        iVar17 = uVar3 - 8;
      }
      uVar13 = iVar17 >> 2;
      if (iVar15 < 2) {
        iVar15 = 1;
      }
      local_58 = CONCAT44(local_58._4_4_,iVar15);
      local_68 = CONCAT44(local_68._4_4_,uVar13 - 1);
      if ((int)uVar13 < 2) {
        uVar13 = 1;
      }
      local_78 = (ulong)uVar13;
      local_3c = uVar11 - 3;
      local_40 = 1;
      if (1 < (int)local_44) {
        local_40 = local_44;
      }
      local_ec = uVar3 - 9;
      uVar9 = 0;
      do {
        uVar13 = (uint)uVar9;
        local_b8 = uVar9;
        if (uVar13 < 2) {
          if (0xb < (int)local_60) {
            uVar11 = 0;
            do {
              if (((((int)uVar9 != 0) || (uVar11 == 0)) || ((uVar11 & 1) != 0)) ||
                 ((int)(uint)local_68 <= (int)uVar11)) {
                local_d8 = (pointer)((ulong)local_d8 & 0xffffffffffffff00);
                uVar9 = 0;
                do {
                  if (7 < local_e0->dataMask) {
                    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument(piVar7,"QRCode maskIndex out of range");
                    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  uVar4 = (uVar3 - 1) - ((uint)uVar9 & 1 | uVar13 * 2);
                  uVar10 = (uVar3 - 1) - ((int)(uVar9 >> 1) + uVar11 * 4);
                  switch(local_e0->dataMask) {
                  case '\0':
                    bVar19 = (uVar10 + uVar4 & 1) == 0;
                    break;
                  case '\x01':
                    bVar19 = (uVar10 & 1) == 0;
                    break;
                  case '\x02':
                    uVar8 = uVar4;
                    goto LAB_00181e49;
                  case '\x03':
                    uVar8 = uVar10 + uVar4;
LAB_00181e49:
                    bVar19 = uVar8 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                    break;
                  case '\x04':
                    uVar8 = uVar10 - ((int)uVar10 >> 0x1f) >> 1;
                    iVar15 = (int)uVar4 / 3;
                    goto LAB_00181e7c;
                  case '\x05':
                    uVar8 = uVar10 * uVar4 * -0x55555555 + 0x2aaaaaaa;
                    bVar19 = (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                    break;
                  case '\x06':
                    bVar19 = (int)(uVar10 * uVar4) % 6 < 3;
                    break;
                  case '\a':
                    uVar8 = uVar10 + uVar4;
                    iVar15 = (int)(uVar10 * uVar4) % 3;
LAB_00181e7c:
                    bVar19 = (iVar15 + uVar8 & 1) == 0;
                  }
                  uVar8 = uVar10;
                  if (local_e0->isMirrored != false) {
                    uVar8 = uVar4;
                    uVar4 = uVar10;
                  }
                  bVar2 = BitMatrix::get(local_b0,uVar4,uVar8);
                  bVar16 = (char)local_d8 * '\x02' | bVar19 ^ bVar2;
                  local_d8 = (pointer)CONCAT71(local_d8._1_7_,bVar16);
                  uVar4 = (uint)uVar9 + 1;
                  uVar9 = (ulong)uVar4;
                } while (uVar4 != 8);
                if (local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                             (iterator)
                             local_a8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(uchar *)&local_d8);
                  uVar9 = local_b8;
                  formatInfo = local_e0;
                }
                else {
                  *local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = bVar16;
                  local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       local_a8._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                  uVar9 = local_b8;
                  formatInfo = local_e0;
                }
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != (uint)local_78);
          }
        }
        else {
          iVar15 = local_44 - uVar13;
          if (iVar15 < 5) {
            if (0x13 < (int)local_60) {
              iVar17 = 0;
              do {
                local_d8 = (pointer)((ulong)local_d8 & 0xffffffffffffff00);
                uVar13 = 0;
                do {
                  if (7 < local_e0->dataMask) {
                    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument(piVar7,"QRCode maskIndex out of range");
                    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  uVar11 = ((uint)(iVar15 == 4) + iVar15 * 2 + -1) - (uVar13 & 1);
                  uVar4 = local_ec - ((uVar13 >> 1) + iVar17 * 4);
                  switch(local_e0->dataMask) {
                  case '\0':
                    bVar19 = (uVar4 + uVar11 & 1) == 0;
                    break;
                  case '\x01':
                    bVar19 = (uVar4 & 1) == 0;
                    break;
                  case '\x02':
                    uVar10 = uVar11;
                    goto LAB_00182039;
                  case '\x03':
                    uVar10 = uVar4 + uVar11;
LAB_00182039:
                    bVar19 = uVar10 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                    break;
                  case '\x04':
                    uVar10 = uVar4 - ((int)uVar4 >> 0x1f) >> 1;
                    iVar18 = (int)uVar11 / 3;
                    goto LAB_0018206c;
                  case '\x05':
                    uVar10 = uVar4 * uVar11 * -0x55555555 + 0x2aaaaaaa;
                    bVar19 = (uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                    break;
                  case '\x06':
                    bVar19 = (int)(uVar4 * uVar11) % 6 < 3;
                    break;
                  case '\a':
                    uVar10 = uVar4 + uVar11;
                    iVar18 = (int)(uVar4 * uVar11) % 3;
LAB_0018206c:
                    bVar19 = (iVar18 + uVar10 & 1) == 0;
                  }
                  uVar10 = uVar4;
                  if (local_e0->isMirrored != false) {
                    uVar10 = uVar11;
                    uVar11 = uVar4;
                  }
                  bVar2 = BitMatrix::get(local_b0,uVar11,uVar10);
                  bVar16 = (char)local_d8 * '\x02' | bVar19 ^ bVar2;
                  local_d8 = (pointer)CONCAT71(local_d8._1_7_,bVar16);
                  uVar13 = uVar13 + 1;
                } while (uVar13 != 8);
                if (local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                             (iterator)
                             local_a8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(uchar *)&local_d8);
                }
                else {
                  *local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = bVar16;
                  local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       local_a8._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                }
                iVar17 = iVar17 + 1;
                uVar9 = local_b8;
                formatInfo = local_e0;
              } while (iVar17 != (uint)local_58);
            }
          }
          else if (1 < (int)local_60) {
            local_e8 = uVar13 * 4;
            iVar15 = 0;
            do {
              if ((iVar15 < (int)local_f0 || (int)uVar9 != 2) &&
                 (((uVar9 & 1) == 0 || (int)uVar9 == (int)local_38) || iVar15 != 0)) {
                iVar17 = ~(iVar15 * 2) + (int)local_60;
                bVar19 = local_3c <= iVar15;
                local_d8 = (pointer)((ulong)local_d8 & 0xffffffffffffff00);
                uVar9 = 0;
                do {
                  if (7 < formatInfo->dataMask) {
                    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument(piVar7,"QRCode maskIndex out of range");
                    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  uVar13 = local_e4 - ((uint)uVar9 & 3 | local_e8);
                  uVar11 = (iVar17 - (uint)bVar19) - (int)(uVar9 >> 2);
                  switch(formatInfo->dataMask) {
                  case '\0':
                    bVar2 = (uVar11 + uVar13 & 1) == 0;
                    break;
                  case '\x01':
                    bVar2 = (uVar11 & 1) == 0;
                    break;
                  case '\x02':
                    uVar4 = uVar13;
                    goto LAB_00182241;
                  case '\x03':
                    uVar4 = uVar11 + uVar13;
LAB_00182241:
                    bVar2 = uVar4 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                    break;
                  case '\x04':
                    uVar4 = uVar11 - ((int)uVar11 >> 0x1f) >> 1;
                    iVar18 = (int)uVar13 / 3;
                    goto LAB_00182274;
                  case '\x05':
                    uVar4 = uVar11 * uVar13 * -0x55555555 + 0x2aaaaaaa;
                    bVar2 = (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                    break;
                  case '\x06':
                    bVar2 = (int)(uVar11 * uVar13) % 6 < 3;
                    break;
                  case '\a':
                    uVar4 = uVar11 + uVar13;
                    iVar18 = (int)(uVar11 * uVar13) % 3;
LAB_00182274:
                    bVar2 = (iVar18 + uVar4 & 1) == 0;
                  }
                  uVar4 = uVar11;
                  if (formatInfo->isMirrored != false) {
                    uVar4 = uVar13;
                    uVar13 = uVar11;
                  }
                  bVar1 = BitMatrix::get(local_b0,uVar13,uVar4);
                  bVar16 = (char)local_d8 * '\x02' | bVar2 ^ bVar1;
                  local_d8 = (pointer)CONCAT71(local_d8._1_7_,bVar16);
                  uVar13 = (uint)uVar9 + 1;
                  uVar9 = (ulong)uVar13;
                } while (uVar13 != 8);
                if (local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_a8,
                             (iterator)
                             local_a8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(uchar *)&local_d8);
                  uVar9 = local_b8;
                }
                else {
                  *local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = bVar16;
                  local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       local_a8._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
                  uVar9 = local_b8;
                }
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 != (uint)local_80);
          }
        }
        uVar13 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar13;
      } while (uVar13 != local_40);
    }
    pBVar6 = local_70;
    *(byte *)local_a8._0_8_ = *(byte *)local_a8._0_8_ & 0xf;
    pBVar5 = local_70;
    if (local_50->_totalCodewords ==
        (int)local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start - local_a8._width) {
      (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70->_width)->
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
      (local_70->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      (local_70->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pBVar5 = &local_a8;
    }
    (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pBVar5->_width)->
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar5->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar5->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pbVar12 = (byte *)local_a8._0_8_;
    if ((byte *)local_a8._0_8_ == (byte *)0x0) {
      return (ByteArray *)pBVar6;
    }
    goto LAB_00182aee;
  case Model2:
    Version::buildFunctionPattern(&local_a8,version);
    local_d8 = (pointer)0x0;
    puStack_d0 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,
               (long)version->_totalCodewords);
    uVar3 = local_b0->_height;
    local_68 = (ulong)uVar3;
    if (1 < (int)uVar3) {
      uVar3 = uVar3 - 1;
      uVar11 = 0;
      local_f0 = CONCAT31(local_f0._1_3_,1);
      local_60 = CONCAT44(local_60._4_4_,uVar3);
      uVar13 = 0;
      do {
        if (uVar3 == 6) {
          uVar3 = 5;
        }
        local_58 = (ulong)uVar3;
        local_80 = (ulong)(int)uVar3;
        uVar9 = 0;
        do {
          local_78 = CONCAT44(local_78._4_4_,(int)uVar9);
          uVar14 = (ulong)(uint)((int)local_60 - (int)uVar9);
          if ((local_f0 & 1) == 0) {
            uVar14 = uVar9;
          }
          iVar17 = (int)uVar14;
          local_b8 = CONCAT44(local_b8._4_4_,(int)(uVar14 >> 0x1f) + iVar17 >> 1);
          local_e4 = CONCAT31(local_e4._1_3_,(uVar14 & 1) == 0);
          iVar15 = iVar17 * (int)local_58;
          iVar18 = 1;
          uVar14 = local_58 & 0xffffffff;
          uVar9 = local_80;
          do {
            if ((ulong)((long)local_a8._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_a8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) <=
                (long)(local_a8._width * iVar17) + uVar9) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,(long)(local_a8._width * iVar17) + uVar9);
            }
            if (local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9 + (long)(local_a8._width * iVar17)]
                != 0) goto LAB_001829f5;
            x = (int)uVar9;
            bVar16 = (byte)local_e4;
            switch(local_e0->dataMask) {
            case '\0':
              bVar16 = (iVar17 + x & 1U) == 0;
              break;
            case '\x01':
              break;
            case '\x02':
              bVar16 = x == (int)(uVar14 / 3) * 3;
              break;
            case '\x03':
              bVar16 = (iVar17 + x) * -0x55555555 + 0x2aaaaaaaU < 0x55555555;
              break;
            case '\x04':
              uVar3 = (int)((uVar9 & 0xffffffff) / 3) + (int)local_b8;
              goto LAB_0018295c;
            case '\x05':
              uVar3 = iVar15 * -0x55555555 + 0x2aaaaaaa;
              bVar16 = (uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) < 0x2aaaaaab;
              break;
            case '\x06':
              bVar16 = iVar15 % 6 < 3;
              break;
            case '\a':
              uVar3 = iVar15 % 3 + iVar17 + x;
LAB_0018295c:
              bVar16 = (uVar3 & 1) == 0;
              break;
            default:
              piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar7,"QRCode maskIndex out of range");
              __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            y = iVar17;
            if (local_e0->isMirrored != false) {
              y = x;
              x = iVar17;
            }
            local_ec = uVar11;
            local_e8 = uVar13;
            bVar19 = BitMatrix::get(local_b0,x,y);
            bVar16 = (char)local_e8 * '\x02' | bVar16 ^ bVar19;
            uVar13 = CONCAT31((int3)(local_e8 >> 8),bVar16);
            uVar11 = local_ec + 1;
            if ((uVar11 & 7) == 0) {
              local_f1 = bVar16;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,
                         &local_f1);
              uVar13 = 0;
            }
LAB_001829f5:
            uVar9 = uVar9 - 1;
            uVar14 = (ulong)((int)uVar14 - 1);
            iVar15 = iVar15 - iVar17;
            iVar18 = iVar18 + -1;
          } while (iVar18 == 0);
          uVar9 = (ulong)((uint)local_78 + 1);
        } while ((uint)local_78 + 1 != (uint)local_68);
        local_f0 = local_f0 ^ 1;
        uVar3 = (int)local_58 - 2;
      } while (2 < (int)local_58);
    }
    break;
  case Micro:
    Version::buildFunctionPattern(&local_a8,version);
    bVar19 = formatInfo->ecLevel == Low;
    local_e8 = version->_versionNumber;
    local_e4 = 2;
    if (local_e8 != 1) {
      local_e4 = bVar19 + 8 + (uint)bVar19;
    }
    local_d8 = (pointer)0x0;
    puStack_d0 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,
               (long)version->_totalCodewords);
    uVar3 = local_b0->_height;
    local_80 = (ulong)uVar3;
    if (1 < (int)uVar3) {
      local_e8 = local_e8 & 0x80000001;
      uVar3 = uVar3 - 1;
      local_78 = (ulong)(int)uVar3;
      iVar15 = 0;
      local_f0 = CONCAT31(local_f0._1_3_,1);
      local_58 = CONCAT44(local_58._4_4_,uVar3);
      bVar16 = 0;
      do {
        local_68 = (ulong)uVar3;
        uVar3 = 0;
        do {
          local_b8 = CONCAT44(local_b8._4_4_,uVar3);
          local_ec = (uint)local_58 - uVar3;
          if ((local_f0 & 1) == 0) {
            local_ec = uVar3;
          }
          iVar17 = -1;
          uVar9 = local_78;
          uVar3 = local_ec;
          do {
            if ((ulong)((long)local_a8._bits.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_a8._bits.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) <=
                uVar9 + (long)(int)(local_a8._width * uVar3)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            if (local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start
                [uVar9 + (long)(int)(local_a8._width * uVar3)] == 0) {
              local_e0 = (FormatInformation *)CONCAT44(local_e0._4_4_,iVar15);
              uVar13 = (uint)uVar9;
              bVar19 = GetDataMaskBit((uint)formatInfo->dataMask,uVar13,uVar3,true);
              uVar11 = uVar3;
              if (formatInfo->isMirrored != false) {
                uVar11 = uVar13;
                uVar13 = uVar3;
              }
              bVar2 = BitMatrix::get(local_b0,uVar13,uVar11);
              bVar16 = bVar16 * '\x02' | bVar19 != bVar2;
              if ((int)local_e0 == 7) {
LAB_001824ef:
                local_f1 = bVar16;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,
                           &local_f1);
                bVar16 = 0;
                iVar15 = 0;
                uVar3 = local_ec;
              }
              else {
                uVar3 = local_ec;
                if ((int)local_e0 == 3) {
                  iVar15 = 4;
                  if (local_e8 == 1) {
                    if (local_e4 == (int)puStack_d0 - (int)local_d8) goto LAB_001824ef;
                  }
                }
                else {
                  iVar15 = (int)local_e0 + 1;
                }
              }
            }
            uVar9 = uVar9 - 1;
            iVar17 = iVar17 + 1;
          } while (iVar17 == 0);
          uVar3 = (int)local_b8 + 1;
        } while (uVar3 != (uint)local_80);
        local_f0 = local_f0 ^ 1;
        uVar3 = (int)local_68 - 2;
        local_78 = local_78 - 2;
      } while (2 < (int)local_68);
    }
    break;
  case rMQR:
    Version::buildFunctionPattern(&local_a8,version);
    local_d8 = (pointer)0x0;
    puStack_d0 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,
               (long)version->_totalCodewords);
    uVar9 = (ulong)local_b0->_width;
    if (2 < (long)uVar9) {
      uVar3 = local_b0->_height;
      local_78 = uVar9 - 2;
      local_f0 = local_b0->_width - 2;
      uVar11 = 0;
      local_80 = CONCAT71(local_80._1_7_,1);
      uVar13 = 0;
      local_58 = CONCAT44(local_58._4_4_,uVar3);
      do {
        local_68 = uVar9;
        if (0 < (int)uVar3) {
          uVar4 = 0;
          do {
            local_b8 = CONCAT44(local_b8._4_4_,uVar4);
            uVar3 = ~uVar4 + uVar3;
            if ((local_80 & 1) == 0) {
              uVar3 = uVar4;
            }
            local_e4 = (int)uVar3 / 2;
            local_e8 = CONCAT31(local_e8._1_3_,(uVar3 & 1) == 0);
            iVar15 = uVar3 * local_f0;
            iVar17 = 1;
            uVar9 = local_78;
            do {
              if ((ulong)((long)local_a8._bits.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_a8._bits.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) <=
                  uVar9 + (long)(int)(local_a8._width * uVar3)) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,(long)(int)(local_a8._width * uVar3) + uVar9);
              }
              if (local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start
                  [uVar9 + (long)(int)(local_a8._width * uVar3)] != 0) goto LAB_0018276e;
              uVar4 = (uint)uVar9;
              bVar16 = (byte)local_e8;
              switch(local_e0->dataMask) {
              case '\0':
                uVar10 = uVar3 + uVar4;
                goto LAB_001826db;
              case '\x01':
                break;
              case '\x02':
                uVar10 = uVar4;
                goto LAB_001826ac;
              case '\x03':
                uVar10 = uVar3 + uVar4;
LAB_001826ac:
                bVar16 = uVar10 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
                break;
              case '\x04':
                uVar10 = (int)uVar4 / 3 + local_e4;
                goto LAB_001826db;
              case '\x05':
                uVar10 = iVar15 * -0x55555555 + 0x2aaaaaaa;
                bVar16 = (uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f) < 0x2aaaaaab;
                break;
              case '\x06':
                bVar16 = iVar15 % 6 < 3;
                break;
              case '\a':
                uVar10 = iVar15 % 3 + uVar3 + uVar4;
LAB_001826db:
                bVar16 = (uVar10 & 1) == 0;
                break;
              default:
                piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(piVar7,"QRCode maskIndex out of range");
                __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              uVar10 = uVar3;
              if (local_e0->isMirrored != false) {
                uVar10 = uVar4;
                uVar4 = uVar3;
              }
              local_ec = uVar13;
              bVar19 = BitMatrix::get(local_b0,uVar4,uVar10);
              bVar16 = (char)local_ec * '\x02' | bVar16 ^ bVar19;
              uVar13 = CONCAT31((int3)(local_ec >> 8),bVar16);
              uVar11 = uVar11 + 1;
              if ((uVar11 & 7) == 0) {
                local_f1 = bVar16;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,
                           &local_f1);
                uVar13 = 0;
              }
LAB_0018276e:
              uVar9 = uVar9 - 1;
              iVar15 = iVar15 - uVar3;
              iVar17 = iVar17 + -1;
            } while (iVar17 == 0);
            uVar4 = (int)local_b8 + 1;
            uVar3 = (uint)local_58;
          } while (uVar4 != (uint)local_58);
        }
        local_80 = local_80 ^ 1;
        local_78 = local_78 - 2;
        local_f0 = local_f0 - 2;
        uVar9 = (ulong)((int)local_68 - 2);
      } while (4 < (int)local_68);
    }
    break;
  default:
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  pBVar6 = local_70;
  pBVar5 = local_70;
  if (local_50->_totalCodewords == (int)puStack_d0 - (int)local_d8) {
    (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70->_width)->
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = local_d8;
    (local_70->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puStack_d0;
    (local_70->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = local_c8;
    pBVar5 = (BitMatrix *)&local_d8;
  }
  (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pBVar5->_width)->
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (pBVar5->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar5->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_d8 != (pointer)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  pbVar12 = local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (local_a8._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
LAB_00182aee:
    operator_delete(pbVar12,(long)local_a8._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar12)
    ;
  }
  return (ByteArray *)pBVar6;
}

Assistant:

ByteArray ReadCodewords(const BitMatrix& bitMatrix, const Version& version, const FormatInformation& formatInfo)
{
	switch (version.type()) {
	case Type::Micro: return ReadMQRCodewords(bitMatrix, version, formatInfo);
	case Type::rMQR: return ReadRMQRCodewords(bitMatrix, version, formatInfo);
	case Type::Model1: return ReadQRCodewordsModel1(bitMatrix, version, formatInfo);
	case Type::Model2: return ReadQRCodewords(bitMatrix, version, formatInfo);
	}

	return {};
}